

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall libtorrent::bt_peer_connection::write_bitfield(bt_peer_connection *this)

{
  long lVar1;
  byte *pbVar2;
  span<char> *this_00;
  bt_peer_connection *pbVar3;
  piece_index_t index;
  piece_picker *this_01;
  bool bVar4;
  int val;
  int iVar5;
  element_type *peVar6;
  long l;
  char *last;
  char *pcVar7;
  unsigned_long __n;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *this_02;
  reference psVar8;
  undefined8 uVar9;
  counters *this_03;
  undefined8 uStack_250;
  char acStack_248 [8];
  counters *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  unsigned_long local_220;
  undefined1 local_211;
  byte *local_210;
  uint local_204;
  int local_200;
  int local_1fc;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *local_1f8;
  undefined1 local_1e9;
  int local_1e8;
  int local_1e4;
  piece_picker *local_1e0;
  byte *local_1d8;
  unsigned_long local_1d0;
  char local_1c2;
  undefined1 local_1c1;
  span<char> *local_1c0;
  char *local_1b8;
  long local_1b0;
  int local_1a4;
  torrent_info *local_1a0;
  int local_198;
  int local_194;
  undefined1 local_18d;
  int local_18c;
  int local_188;
  int local_184;
  torrent *local_180;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *local_178;
  int local_16c;
  int local_168;
  int local_164;
  torrent *local_160;
  typed_bitfield<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>
  *local_158;
  undefined1 local_149;
  bt_peer_connection *local_148;
  span<const_char> local_140;
  ulong local_130;
  size_t k;
  size_t n_pieces;
  string bitfield_string;
  const_iterator cStack_f8;
  piece_index_t p_1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
  *__range1;
  piece_index_t local_d8;
  int local_d4;
  piece_index_t i;
  int mask;
  piece_picker *p;
  byte *local_c0;
  char *ptr;
  alloca_destructor<char> msg_destructor;
  char *TORRENT_ALLOCA_tmp;
  long TORRENT_ALLOCA_size;
  span<char> msg;
  int packet_size;
  uint8_t char_top_bit;
  uint8_t char_bit_mask;
  int num_pieces;
  piece_index_t local_58;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_54;
  int local_50;
  int local_4c;
  piece_index_t local_48;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_44;
  piece_index_t local_40;
  piece_index_t piece;
  undefined1 local_30 [16];
  undefined1 local_20 [8];
  shared_ptr<libtorrent::torrent> t;
  bt_peer_connection *this_local;
  
  uStack_250 = 0x37e4f0;
  local_148 = this;
  t.super___shared_ptr<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  peer_connection::associated_torrent((peer_connection *)local_30);
  uStack_250 = 0x37e4fd;
  std::weak_ptr<libtorrent::torrent>::lock((weak_ptr<libtorrent::torrent> *)local_20);
  uStack_250 = 0x37e506;
  std::weak_ptr<libtorrent::torrent>::~weak_ptr((weak_ptr<libtorrent::torrent> *)local_30);
  uStack_250 = 0x37e51f;
  peVar6 = std::__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  uStack_250 = 0x37e527;
  local_149 = torrent::super_seeding(peVar6);
  if ((bool)local_149) {
    uStack_250 = 0x37e55f;
    peer_connection::peer_log
              (&local_148->super_peer_connection,info,"BITFIELD",
               "not sending bitfield, super seeding");
    if (((byte)(local_148->super_peer_connection).field_0x765 >> 2 & 1) != 0) {
      uStack_250 = 0x37e581;
      write_have_none(local_148);
    }
    (local_148->super_peer_connection).field_0x765 =
         (local_148->super_peer_connection).field_0x765 | 8;
    uStack_250 = 0x37e5b5;
    local_160 = std::
                __shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_20);
    uStack_250 = 0x37e5c8;
    local_158 = peer_connection::get_bitfield(&local_148->super_peer_connection);
    uStack_250 = 0x37e5e4;
    local_164 = (int)torrent::get_piece_to_super_seed(local_160,local_158);
    uStack_250 = 0x37e5fe;
    local_40 = (piece_index_t)local_164;
    local_168 = libtorrent::aux::strong_typedef::operator_cast_to_int((strong_typedef *)&local_40);
    uStack_250 = 0x37e611;
    libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
              (&local_44,0);
    uStack_250 = 0x37e61c;
    local_16c = libtorrent::aux::strong_typedef::operator_cast_to_int((strong_typedef *)&local_44);
    if (local_16c <= local_168) {
      uStack_250 = 0x37e642;
      libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                (&local_48,-1);
      local_4c = local_40.m_val;
      uStack_250 = 0x37e65c;
      peer_connection::superseed_piece(&local_148->super_peer_connection,local_48,local_40);
    }
    uStack_250 = 0x37e669;
    local_180 = std::
                __shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_20);
    uStack_250 = 0x37e67c;
    local_178 = peer_connection::get_bitfield(&local_148->super_peer_connection);
    uStack_250 = 0x37e698;
    local_184 = (int)torrent::get_piece_to_super_seed(local_180,local_178);
    uStack_250 = 0x37e6b8;
    local_50 = local_184;
    local_40 = (piece_index_t)local_184;
    local_188 = libtorrent::aux::strong_typedef::operator_cast_to_int((strong_typedef *)&local_40);
    uStack_250 = 0x37e6cb;
    libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
              (&local_54,0);
    uStack_250 = 0x37e6d6;
    local_18c = libtorrent::aux::strong_typedef::operator_cast_to_int((strong_typedef *)&local_54);
    pcVar7 = acStack_248;
    if (local_18c <= local_188) {
      uStack_250 = 0x37e6fc;
      libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef
                (&local_58,-1);
      uStack_250 = 0x37e716;
      peer_connection::superseed_piece(&local_148->super_peer_connection,local_58,local_40);
      pcVar7 = acStack_248;
    }
  }
  else {
    if (((byte)(local_148->super_peer_connection).field_0x765 >> 2 & 1) != 0) {
      uStack_250 = 0x37e745;
      peVar6 = std::
               __shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_20);
      uStack_250 = 0x37e74d;
      local_18d = torrent::is_seed(peVar6);
      if ((bool)local_18d) {
        uStack_250 = 0x37e76d;
        write_have_all(local_148);
        pcVar7 = acStack_248;
        goto LAB_0037eeaf;
      }
    }
    if (((byte)(local_148->super_peer_connection).field_0x765 >> 2 & 1) != 0) {
      uStack_250 = 0x37e79a;
      peVar6 = std::
               __shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_20);
      uStack_250 = 0x37e7a2;
      local_194 = torrent::num_have(peVar6);
      if (local_194 == 0) {
        uStack_250 = 0x37e7c1;
        write_have_none(local_148);
        pcVar7 = acStack_248;
        goto LAB_0037eeaf;
      }
    }
    uStack_250 = 0x37e7d8;
    peVar6 = std::__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_20);
    uStack_250 = 0x37e7e0;
    local_198 = torrent::num_have(peVar6);
    if (local_198 == 0) {
      uStack_250 = 0x37e814;
      peer_connection::peer_log
                (&local_148->super_peer_connection,info,"BITFIELD","not sending bitfield, have none"
                );
      (local_148->super_peer_connection).field_0x765 =
           (local_148->super_peer_connection).field_0x765 & 0xf7 | 8;
      pcVar7 = acStack_248;
    }
    else {
      uStack_250 = 0x37e848;
      peVar6 = std::
               __shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_20);
      uStack_250 = 0x37e850;
      local_1a0 = torrent::torrent_file(peVar6);
      uStack_250 = 0x37e865;
      val = libtorrent::torrent_info::num_pieces(local_1a0);
      iVar5 = val + 7;
      if (val + 7 < 0) {
        iVar5 = val + 0xe;
      }
      iVar5 = iVar5 >> 3;
      uStack_250 = 0x37e8a4;
      local_1a4 = val;
      span<char>::span((span<char> *)&TORRENT_ALLOCA_size);
      uStack_250 = 0x37e8ac;
      l = libtorrent::aux::numeric_cast<long,int,void>(iVar5 + 5);
      lVar1 = -(l + 0xfU & 0xfffffffffffffff0);
      local_1b0 = l;
      *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37e8fc;
      span<char>::span((span<char> *)&msg_destructor.objects.m_len,acStack_248 + lVar1,l);
      TORRENT_ALLOCA_size = msg_destructor.objects.m_len;
      local_1c0 = (span<char> *)&TORRENT_ALLOCA_size;
      *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37e917;
      local_1b8 = span<char>::begin((span<char> *)&TORRENT_ALLOCA_size);
      this_00 = local_1c0;
      *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37e92a;
      last = span<char>::end(this_00);
      pcVar7 = local_1b8;
      *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37e939;
      libtorrent::aux::uninitialized_default_construct<char*>(pcVar7,last);
      *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37e94b;
      span<char>::span<libtorrent::span<char>,char,void>
                ((span<char> *)&ptr,(span<char> *)&TORRENT_ALLOCA_size);
      *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37e956;
      pcVar7 = span<char>::data((span<char> *)&TORRENT_ALLOCA_size);
      if (pcVar7 != (char *)0x0) {
        *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37e971;
        local_c0 = (byte *)span<char>::begin((span<char> *)&TORRENT_ALLOCA_size);
        *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37e98a;
        detail::write_int32<int,char*>(iVar5 + 1,(char **)&local_c0);
        *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37e99d;
        detail::write_uint8<libtorrent::bt_peer_connection::message_type,char*>
                  (msg_bitfield,(char **)&local_c0);
        *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37e9a8;
        peVar6 = std::
                 __shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_20);
        *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37e9b0;
        local_1c1 = torrent::is_seed(peVar6);
        pbVar2 = local_c0;
        if ((bool)local_1c1) {
          p._7_1_ = 0xff;
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37e9e4;
          std::fill_n<char*,int,unsigned_char>((char *)pbVar2,iVar5,(uchar *)((long)&p + 7));
          local_1c2 = (char)(0xff << (8 - ((byte)val & 7) & 7));
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ea11;
          pcVar7 = span<char>::back((span<char> *)&TORRENT_ALLOCA_size);
          *pcVar7 = local_1c2;
        }
        else {
          local_1d8 = local_c0;
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ea48;
          __n = libtorrent::aux::numeric_cast<unsigned_long,int,void>(iVar5);
          pbVar2 = local_1d8;
          local_1d0 = __n;
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ea66;
          memset(pbVar2,0,__n);
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ea6f;
          peVar6 = std::
                   __shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_20);
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ea77;
          local_1e0 = torrent::picker(peVar6);
          local_d4 = 0x80;
          _i = local_1e0;
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37eaab;
          memset(&local_d8,0,4);
          while( true ) {
            *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37eab7;
            local_1e4 = libtorrent::aux::strong_typedef::operator_cast_to_int
                                  ((strong_typedef *)&local_d8);
            *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37eace;
            libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::
            strong_typedef((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                           ((long)&__range1 + 4),val);
            *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37eadc;
            local_1e8 = libtorrent::aux::strong_typedef::operator_cast_to_int
                                  ((strong_typedef *)((long)&__range1 + 4));
            this_01 = _i;
            index.m_val = local_d8.m_val;
            if (local_1e8 <= local_1e4) break;
            __range1._0_4_ = local_d8.m_val;
            *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37eb16;
            local_1e9 = piece_picker::have_piece(this_01,index);
            if ((bool)local_1e9) {
              *local_c0 = *local_c0 | (byte)local_d4;
            }
            local_d4 = local_d4 >> 1;
            if (local_d4 == 0) {
              local_d4 = 0x80;
              local_c0 = local_c0 + 1;
            }
            *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37eb7f;
            libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator++
                      (&local_d8);
          }
        }
        *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37eb91;
        peVar6 = std::
                 __shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::torrent,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_20);
        *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37eb99;
        this_02 = torrent::predictive_pieces(peVar6);
        local_1f8 = this_02;
        *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ebbc;
        __end1 = std::
                 vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                 ::begin(this_02);
        *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ebcf;
        cStack_f8 = std::
                    vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>
                    ::end(this_02);
        while( true ) {
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ebe9;
          bVar4 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff08);
          pbVar3 = local_148;
          if (!bVar4) break;
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ebfe;
          psVar8 = __gnu_cxx::
                   __normal_iterator<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
                   ::operator*(&__end1);
          bitfield_string.field_2._12_4_ = psVar8->m_val;
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ec12;
          local_1fc = libtorrent::aux::strong_typedef::operator_cast_to_int
                                ((strong_typedef *)(bitfield_string.field_2._M_local_buf + 0xc));
          local_204 = 0x80 >> ((byte)local_1fc & 7);
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ec3e;
          local_200 = libtorrent::aux::strong_typedef::operator_cast_to_int
                                ((strong_typedef *)(bitfield_string.field_2._M_local_buf + 0xc));
          iVar5 = local_200;
          if (local_200 < 0) {
            iVar5 = local_200 + 7;
          }
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ec68;
          local_210 = (byte *)span<char>::operator[]
                                        ((span<char> *)&TORRENT_ALLOCA_size,(long)((iVar5 >> 3) + 5)
                                        );
          *local_210 = *local_210 | (byte)local_204;
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ec91;
          __gnu_cxx::
          __normal_iterator<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_*,_std::vector<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::allocator<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>_>_>
          ::operator++(&__end1);
        }
        *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37eca7;
        local_211 = peer_connection::should_log(&pbVar3->super_peer_connection,outgoing_message);
        if ((bool)local_211) {
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ecca;
          std::__cxx11::string::string((string *)&n_pieces);
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ecd2;
          local_220 = libtorrent::aux::numeric_cast<unsigned_long,int,void>(val);
          k = local_220;
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ecfc;
          std::__cxx11::string::resize((ulong)&n_pieces);
          for (local_130 = 0; local_130 < k; local_130 = local_130 + 1) {
            iVar5 = (int)local_130;
            if ((int)local_130 < 0) {
              iVar5 = (int)local_130 + 7;
            }
            *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ed3f;
            local_228 = span<char>::operator[]
                                  ((span<char> *)&TORRENT_ALLOCA_size,(long)((iVar5 >> 3) + 5));
            if (((int)*local_228 & 0x80 >> ((byte)local_130 & 7)) == 0) {
              *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37edc5;
              local_238 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&n_pieces);
              *local_238 = 0x30;
            }
            else {
              *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ed80;
              local_230 = (undefined1 *)std::__cxx11::string::operator[]((ulong)&n_pieces);
              *local_230 = 0x31;
            }
          }
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37edfd;
          uVar9 = std::__cxx11::string::c_str();
          pbVar3 = local_148;
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ee21;
          peer_connection::peer_log
                    (&pbVar3->super_peer_connection,outgoing_message,"BITFIELD","%s",uVar9);
          *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ee2d;
          std::__cxx11::string::~string((string *)&n_pieces);
        }
        (local_148->super_peer_connection).field_0x765 =
             (local_148->super_peer_connection).field_0x765 | 8;
        *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ee53;
        span<char_const>::span<libtorrent::span<char>,char,void>
                  ((span<char_const> *)&local_140,(span<char> *)&TORRENT_ALLOCA_size);
        pbVar3 = local_148;
        *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ee6f;
        peer_connection::send_buffer(&pbVar3->super_peer_connection,local_140);
        pbVar3 = local_148;
        *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ee7d;
        this_03 = peer_connection::stats_counters(&pbVar3->super_peer_connection);
        local_240 = this_03;
        *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37ee9c;
        counters::inc_stats_counter(this_03,0x5b,1);
      }
      *(undefined8 *)((long)&uStack_250 + lVar1) = 0x37eeaf;
      libtorrent::aux::alloca_destructor<char>::~alloca_destructor((alloca_destructor<char> *)&ptr);
      pcVar7 = acStack_248 + lVar1;
    }
  }
LAB_0037eeaf:
  pcVar7[-8] = -0x48;
  pcVar7[-7] = -0x12;
  pcVar7[-6] = '7';
  pcVar7[-5] = '\0';
  pcVar7[-4] = '\0';
  pcVar7[-3] = '\0';
  pcVar7[-2] = '\0';
  pcVar7[-1] = '\0';
  std::shared_ptr<libtorrent::torrent>::~shared_ptr((shared_ptr<libtorrent::torrent> *)local_20);
  return;
}

Assistant:

void bt_peer_connection::write_bitfield()
	{
		INVARIANT_CHECK;

		// if we have not received the other peer's extension bits yet, how do we
		// know whether to send a have-all or have-none?
		TORRENT_ASSERT(m_state >= state_t::read_peer_id);

		std::shared_ptr<torrent> t = associated_torrent().lock();
		TORRENT_ASSERT(t);
		TORRENT_ASSERT(m_sent_handshake);
		TORRENT_ASSERT(t->valid_metadata());

#ifndef TORRENT_DISABLE_SUPERSEEDING
		if (t->super_seeding())
		{
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "BITFIELD", "not sending bitfield, super seeding");
#endif
			if (m_supports_fast) write_have_none();

			// if we are super seeding, pretend to not have any piece
			// and don't send a bitfield
			m_sent_bitfield = true;

			// bootstrap super-seeding by sending two have message
			piece_index_t piece = t->get_piece_to_super_seed(get_bitfield());
			if (piece >= piece_index_t(0)) superseed_piece(piece_index_t(-1), piece);
			piece = t->get_piece_to_super_seed(get_bitfield());
			if (piece >= piece_index_t(0)) superseed_piece(piece_index_t(-1), piece);
			return;
		}
		else
#endif
			if (m_supports_fast && t->is_seed())
		{
			write_have_all();
			return;
		}
		else if (m_supports_fast && t->num_have() == 0)
		{
			write_have_none();
			return;
		}
		else if (t->num_have() == 0)
		{
			// don't send a bitfield if we don't have any pieces
#ifndef TORRENT_DISABLE_LOGGING
			peer_log(peer_log_alert::info, "BITFIELD", "not sending bitfield, have none");
#endif
			m_sent_bitfield = true;
			return;
		}

		const int num_pieces = t->torrent_file().num_pieces();
		TORRENT_ASSERT(num_pieces > 0);

		constexpr std::uint8_t char_bit_mask = CHAR_BIT - 1;
		constexpr std::uint8_t char_top_bit = 1 << (CHAR_BIT - 1);

		const int packet_size = (num_pieces + char_bit_mask) / CHAR_BIT + 5;

		TORRENT_ALLOCA(msg, char, packet_size);
		if (msg.data() == nullptr) return; // out of memory
		auto ptr = msg.begin();

		detail::write_int32(packet_size - 4, ptr);
		detail::write_uint8(msg_bitfield, ptr);

		if (t->is_seed())
		{
			std::fill_n(ptr, packet_size - 5, std::uint8_t{0xff});

			// Clear trailing bits
			msg.back() = static_cast<char>((0xff << ((CHAR_BIT - (num_pieces & char_bit_mask)) & char_bit_mask)) & 0xff);
		}
		else
		{
			std::memset(ptr, 0, aux::numeric_cast<std::size_t>(packet_size - 5));
			piece_picker const& p = t->picker();
			int mask = char_top_bit;
			for (piece_index_t i(0); i < piece_index_t(num_pieces); ++i)
			{
				if (p.have_piece(i)) *ptr |= mask;
				mask >>= 1;
				if (mask == 0)
				{
					mask = char_top_bit;
					++ptr;
				}
			}
		}

#ifndef TORRENT_DISABLE_PREDICTIVE_PIECES
		// add predictive pieces to the bitfield as well, since we won't
		// announce them again
		for (piece_index_t const p : t->predictive_pieces())
			msg[5 + static_cast<int>(p) / CHAR_BIT] |= (char_top_bit >> (static_cast<int>(p) & char_bit_mask));
#endif

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::outgoing_message))
		{
			std::string bitfield_string;
			std::size_t const n_pieces = aux::numeric_cast<std::size_t>(num_pieces);
			bitfield_string.resize(n_pieces);
			for (std::size_t k = 0; k < n_pieces; ++k)
			{
				if (msg[5 + int(k) / CHAR_BIT] & (char_top_bit >> (k % CHAR_BIT))) bitfield_string[k] = '1';
				else bitfield_string[k] = '0';
			}
			peer_log(peer_log_alert::outgoing_message, "BITFIELD"
				, "%s", bitfield_string.c_str());
		}
#endif
		m_sent_bitfield = true;

		send_buffer(msg);

		stats_counters().inc_stats_counter(counters::num_outgoing_bitfield);
	}